

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsIntPermuteConvertCopy
              (FmsIntType src_type,void *src,FmsIntType dst_type,void *dst,int *perm,
              FmsInt tuple_size,FmsInt tot_size)

{
  FmsIntType FVar1;
  int iVar2;
  FmsInt j_16;
  
  j_16 = (FmsInt)dst_type;
  FVar1 = dst_type | src_type;
  iVar2 = CONCAT31((int3)(FVar1 >> 8),FMS_INT_TYPE < FVar1);
  if ((tuple_size != 0 && FMS_INT_TYPE >= FVar1) &&
     (iVar2 = (int)(tot_size / tuple_size), tot_size % tuple_size == 0)) {
    iVar2 = (*(code *)(&DAT_00114280 + *(int *)(&DAT_00114280 + j_16 * 4)))();
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int FmsIntPermuteConvertCopy(FmsIntType src_type, const void *src,
                                    FmsIntType dst_type, void *dst,
                                    const int *perm, FmsInt tuple_size,
                                    FmsInt tot_size) {
  if (src_type >= FMS_NUM_INT_TYPES || dst_type >= FMS_NUM_INT_TYPES) {
    E_RETURN(1);
  }
  if (tuple_size == 0 || tot_size % tuple_size != 0) { E_RETURN(2); }
  const FmsInt ts = tuple_size;
  switch (dst_type) {
  case FMS_INT8:   FMS_IPCC_SW(src_type,src,  int8_t,dst,ts,perm,tot_size);
  case FMS_INT16:  FMS_IPCC_SW(src_type,src, int16_t,dst,ts,perm,tot_size);
  case FMS_INT32:  FMS_IPCC_SW(src_type,src, int32_t,dst,ts,perm,tot_size);
  case FMS_INT64:  FMS_IPCC_SW(src_type,src, int64_t,dst,ts,perm,tot_size);
  case FMS_UINT8:  FMS_IPCC_SW(src_type,src, uint8_t,dst,ts,perm,tot_size);
  case FMS_UINT16: FMS_IPCC_SW(src_type,src,uint16_t,dst,ts,perm,tot_size);
  case FMS_UINT32: FMS_IPCC_SW(src_type,src,uint32_t,dst,ts,perm,tot_size);
  case FMS_UINT64: FMS_IPCC_SW(src_type,src,uint64_t,dst,ts,perm,tot_size);
  default: FmsAbortNotImplemented();
  }
  return 0;
}